

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_toggle<EasyUseDenseHashMap<HashObject<8,8>,int,HashFn>>(int iters)

{
  int in_EDI;
  size_t finish;
  double ut;
  size_t start;
  int i;
  Rusage t;
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff48;
  HashObject<8,_8> *in_stack_ffffffffffffff50;
  Rusage *in_stack_ffffffffffffff60;
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *in_stack_ffffffffffffff80;
  int local_78;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  double in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap(in_stack_ffffffffffffff80)
  ;
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff50);
  CurrentMemoryUsage();
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff50);
  for (local_78 = 0; local_78 < in_EDI; local_78 = local_78 + 1) {
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    in_stack_ffffffffffffff50 =
         (HashObject<8,_8> *)
         google::
         dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::operator[]((dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                       *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50->i_ = local_78 + 1;
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    google::
    dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::erase((dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
             *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  Rusage::UserTime(in_stack_ffffffffffffff60);
  CurrentMemoryUsage();
  report(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
         in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d8849);
  return;
}

Assistant:

static void time_map_toggle(int iters) {
  MapType set;
  Rusage t;
  int i;

  const size_t start = CurrentMemoryUsage();
  t.Reset();
  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
    set.erase(i);
  }

  double ut = t.UserTime();
  const size_t finish = CurrentMemoryUsage();

  report("map_toggle", ut, iters, start, finish);
}